

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaValidator.cpp
# Opt level: O3

void __thiscall xercesc_4_0::SchemaValidator::~SchemaValidator(SchemaValidator *this)

{
  XMemory *this_00;
  XMLBuffer *this_01;
  MemoryManager *pMVar1;
  void *in_RSI;
  XMLCh *p;
  
  (this->super_XMLValidator)._vptr_XMLValidator = (_func_int **)&PTR__SchemaValidator_0040f210;
  if (this->fXsiType != (QName *)0x0) {
    (*(this->fXsiType->super_XSerializable)._vptr_XSerializable[1])();
  }
  this_00 = (XMemory *)this->fTypeStack;
  if (this_00 != (XMemory *)0x0) {
    in_RSI = *(void **)(this_00 + 0x20);
    (**(code **)(**(long **)(this_00 + 0x28) + 0x20))();
  }
  XMemory::operator_delete(this_00,in_RSI);
  this_01 = this->fNotationBuf;
  if (this_01 != (XMLBuffer *)0x0) {
    p = this_01->fBuffer;
    (*this_01->fMemoryManager->_vptr_MemoryManager[4])();
    XMemory::operator_delete((XMemory *)this_01,p);
  }
  pMVar1 = (this->fDatatypeBuffer).fMemoryManager;
  (*pMVar1->_vptr_MemoryManager[4])(pMVar1,(this->fDatatypeBuffer).fBuffer);
  return;
}

Assistant:

SchemaValidator::~SchemaValidator()
{
    delete fXsiType;
    delete fTypeStack;

    if (fNotationBuf)
        delete fNotationBuf;
}